

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O3

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,ScopedMessage *other)

{
  pointer pcVar1;
  
  (this->m_info).macroName._M_dataplus._M_p = (pointer)&(this->m_info).macroName.field_2;
  pcVar1 = (other->m_info).macroName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->m_info).macroName._M_string_length);
  (this->m_info).lineInfo.file._M_dataplus._M_p = (pointer)&(this->m_info).lineInfo.file.field_2;
  pcVar1 = (other->m_info).lineInfo.file._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).lineInfo,pcVar1,
             pcVar1 + (other->m_info).lineInfo.file._M_string_length);
  (this->m_info).lineInfo.line = (other->m_info).lineInfo.line;
  (this->m_info).type = (other->m_info).type;
  (this->m_info).message._M_dataplus._M_p = (pointer)&(this->m_info).message.field_2;
  pcVar1 = (other->m_info).message._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_info).message,pcVar1,
             pcVar1 + (other->m_info).message._M_string_length);
  (this->m_info).sequence = (other->m_info).sequence;
  return;
}

Assistant:

ScopedMessage::ScopedMessage( ScopedMessage const& other )
    : m_info( other.m_info )
    {}